

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  uint8_t *puVar1;
  undefined1 *puVar2;
  DictWord *pDVar3;
  long lVar4;
  DictWord *pDVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  undefined4 uVar12;
  long lVar13;
  uint64_t uVar14;
  uint16_t *puVar15;
  uint16_t *puVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  uint8_t *puVar21;
  size_t sVar22;
  uint uVar23;
  int iVar24;
  DictWord *pDVar25;
  size_t *psVar26;
  uint8_t *puVar27;
  ulong uVar28;
  BrotliTransforms *pBVar29;
  uint8_t *puVar30;
  int *piVar31;
  ulong uVar32;
  byte bVar33;
  long lVar34;
  char *pcVar35;
  bool bVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  DictWord *pDVar40;
  long lVar41;
  int last_distance;
  ulong uVar42;
  ushort uVar43;
  DictWord *pDVar44;
  undefined1 *puVar45;
  int iVar46;
  size_t *psVar47;
  DictWord *pDVar48;
  DictWord *pDVar49;
  size_t *psVar50;
  DictWord *pDVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  uint uVar55;
  uint32_t *buckets;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  uint uVar61;
  uint uVar62;
  size_t sVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  bool bVar67;
  ulong local_158;
  ulong local_140;
  ulong local_130;
  DictWord *local_128;
  DictWord *local_110;
  ulong local_100;
  DictWord *local_e8;
  DictWord *local_d8;
  ulong local_c0;
  size_t *local_b0;
  uint8_t *local_a0;
  
  bVar33 = literal_context_lut[8];
  lVar13 = *(long *)(literal_context_lut + 0x10);
  local_c0 = *(ulong *)dist_cache;
  pDVar3 = (DictWord *)(position + num_bytes);
  pDVar25 = (DictWord *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    pDVar25 = (DictWord *)position;
  }
  lVar34 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar34 = 0x40;
  }
  iVar39 = *(int *)&(params->dictionary).words;
  if (4 < iVar39) {
    iVar37 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar37 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar37 + 1;
    (hasher->common).params.type = iVar37 + -2;
    (hasher->common).params.bucket_bits = iVar37 + 2;
    (hasher->common).params.block_bits = iVar37 + -3;
    (hasher->common).params.hash_len = iVar37 + 3;
    if (10 < iVar39) {
      iVar39 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar39 + -1;
      (hasher->common).is_prepared_ = iVar39 + 1;
      *(int *)&hasher->privat = iVar39 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar39 + 2;
      *(int *)((long)&hasher->privat + 8) = iVar39 + -3;
      *(int *)((long)&hasher->privat + 0xc) = iVar39 + 3;
    }
  }
  if (pDVar3 <= (DictWord *)(position + 8)) {
    local_b0 = last_insert_len;
LAB_00120e92:
    *(undefined1 **)dist_cache = (undefined1 *)((long)pDVar3 + (local_c0 - position));
    *(long *)commands = *(long *)commands + ((long)local_b0 - (long)last_insert_len >> 4);
    return;
  }
  pDVar5 = (DictWord *)((1L << (bVar33 & 0x3f)) - 0x10);
  local_a0 = (uint8_t *)(lVar34 + position);
  puVar1 = &pDVar3[-2].transform;
  lVar4 = position - 1;
  local_b0 = last_insert_len;
  pDVar49 = (DictWord *)position;
LAB_0011ee21:
  pDVar40 = pDVar5;
  if (pDVar49 < pDVar5) {
    pDVar40 = pDVar49;
  }
  pDVar48 = (DictWord *)(&pDVar49->len + lVar13);
  if (pDVar5 <= (DictWord *)(&pDVar49->len + lVar13)) {
    pDVar48 = pDVar5;
  }
  pDVar44 = *(DictWord **)(literal_context_lut + 0x50);
  uVar14 = (params->dictionary).cutoffTransforms;
  puVar15 = (params->dictionary).hash_table_words;
  psVar50 = *(size_t **)backward_references;
  bVar67 = psVar50 < back_refs_position;
  if ((bVar67) && ((DictWord *)(long)(int)num_literals[(long)psVar50 * 2] < pDVar49)) {
    psVar26 = num_literals + (long)psVar50 * 2 + 2;
    psVar47 = psVar50;
    do {
      psVar47 = (size_t *)((long)psVar47 + 1);
      psVar50 = back_refs_position;
      if (back_refs_position == psVar47) break;
      sVar22 = *psVar26;
      psVar26 = psVar26 + 2;
      psVar50 = psVar47;
    } while ((DictWord *)(long)(int)sVar22 < pDVar49);
    *(size_t **)backward_references = psVar47;
    bVar67 = psVar47 < back_refs_position;
  }
  local_130 = (long)pDVar3 - (long)pDVar49;
  uVar56 = (ulong)pDVar49 & ringbuffer_mask;
  uVar61 = (uint)ringbuffer_mask;
  uVar38 = (uint)local_130;
  if ((bVar67) && (pDVar49 == (DictWord *)(long)(int)num_literals[(long)psVar50 * 2])) {
    uVar62 = (uint)num_literals[(long)psVar50 * 2 + 1];
    local_110 = (DictWord *)(long)(int)uVar62;
    local_100 = 0x7e4;
    bVar20 = true;
    if (((DictWord *)((long)pDVar49 - (long)local_110) < pDVar49) &&
       (uVar62 <= *(uint *)((long)num_literals + (long)psVar50 * 0x10 + 0xc))) {
      uVar64 = (ulong)((long)pDVar49 - (long)local_110) & ringbuffer_mask;
      if (7 < local_130) {
        uVar59 = local_130 & 0xfffffffffffffff8;
        puVar27 = ringbuffer + uVar59 + uVar56;
        lVar60 = 0;
        uVar57 = 0;
LAB_0012096c:
        uVar28 = *(ulong *)(ringbuffer + uVar56 + uVar57 * 8);
        if (uVar28 == *(ulong *)(ringbuffer + uVar57 * 8 + uVar64)) goto code_r0x00120979;
        uVar28 = *(ulong *)(ringbuffer + uVar57 * 8 + uVar64) ^ uVar28;
        uVar64 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
          }
        }
        uVar57 = (uVar64 >> 3 & 0x1fffffff) - lVar60;
        goto LAB_001209dd;
      }
      uVar59 = 0;
      puVar27 = ringbuffer + uVar56;
LAB_00120e54:
      uVar28 = local_130 & 7;
      uVar57 = uVar59;
      if (uVar28 != 0) {
        uVar65 = uVar59 | uVar28;
        do {
          uVar57 = uVar59;
          if (ringbuffer[uVar59 + uVar64] != *puVar27) break;
          puVar27 = puVar27 + 1;
          uVar59 = uVar59 + 1;
          uVar28 = uVar28 - 1;
          uVar57 = uVar65;
        } while (uVar28 != 0);
      }
LAB_001209dd:
      local_128 = (DictWord *)(long)*(int *)((long)num_literals + (long)psVar50 * 0x10 + 4);
      if (uVar57 < local_128) {
        local_128 = (DictWord *)uVar57;
      }
      iVar39 = 0x1f;
      if (uVar62 != 0) {
        for (; uVar62 >> iVar39 == 0; iVar39 = iVar39 + -1) {
        }
      }
      local_100 = (ulong)(iVar39 * -0x1e + 0x780) + (long)local_128 * 0x87;
      bVar36 = true;
      bVar20 = false;
    }
    else {
      bVar36 = false;
      local_110 = (DictWord *)0x0;
      local_128 = (DictWord *)0x0;
    }
    iVar39 = 0;
    if (bVar20) goto LAB_0011f3bd;
  }
  else {
    uVar64 = (ulong)*(int *)&(params->dictionary).words;
    if (uVar64 == 0) {
      local_100 = 0x7e4;
      local_110 = (DictWord *)0x0;
      local_128 = (DictWord *)0x0;
      uVar59 = 0;
    }
    else {
      puVar27 = ringbuffer + uVar56;
      uVar57 = (ulong)(uVar38 & 7);
      local_100 = 0x7e4;
      uVar59 = 0;
      uVar28 = 0;
      local_128 = (DictWord *)0x0;
      local_110 = (DictWord *)0x0;
      do {
        pDVar51 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + uVar28 * 4);
        if (((pDVar51 <= pDVar40) && ((DictWord *)((long)pDVar49 - (long)pDVar51) < pDVar49)) &&
           (uVar56 + uVar59 <= ringbuffer_mask)) {
          uVar65 = (ulong)((long)pDVar49 - (long)pDVar51) & ringbuffer_mask;
          if ((uVar65 + uVar59 <= ringbuffer_mask) &&
             (ringbuffer[uVar56 + uVar59] == ringbuffer[uVar65 + uVar59])) {
            if (7 < local_130) {
              lVar60 = 0;
              uVar52 = 0;
LAB_0011f044:
              if (*(ulong *)(puVar27 + uVar52 * 8) == *(ulong *)(ringbuffer + uVar52 * 8 + uVar65))
              goto code_r0x0011f051;
              uVar52 = *(ulong *)(ringbuffer + uVar52 * 8 + uVar65) ^
                       *(ulong *)(puVar27 + uVar52 * 8);
              uVar65 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
                }
              }
              uVar52 = (uVar65 >> 3 & 0x1fffffff) - lVar60;
              goto LAB_0011f07c;
            }
            uVar32 = 0;
            puVar30 = puVar27;
LAB_0011f119:
            uVar52 = uVar32;
            if (uVar57 != 0) {
              uVar54 = uVar57 | uVar32;
              uVar42 = uVar57;
              do {
                uVar52 = uVar32;
                if (ringbuffer[uVar32 + uVar65] != *puVar30) break;
                puVar30 = puVar30 + 1;
                uVar32 = uVar32 + 1;
                uVar42 = uVar42 - 1;
                uVar52 = uVar54;
              } while (uVar42 != 0);
            }
LAB_0011f07c:
            if ((bVar67) &&
               ((undefined1 *)(long)(int)num_literals[(long)psVar50 * 2] < &pDVar49->len + uVar52))
            {
              uVar52 = (long)(int)num_literals[(long)psVar50 * 2] - (long)pDVar49;
            }
            if (((2 < uVar52) || ((uVar28 < 2 && (uVar52 == 2)))) &&
               (uVar65 = uVar52 * 0x87 + 0x78f, local_100 < uVar65)) {
              if (uVar28 != 0) {
                uVar65 = uVar65 - ((0x1ca10U >> ((byte)uVar28 & 0xe) & 0xe) + 0x27);
              }
              if (local_100 < uVar65) {
                uVar59 = uVar52;
                local_128 = (DictWord *)uVar52;
                local_110 = pDVar51;
                local_100 = uVar65;
              }
            }
          }
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar64);
    }
    uVar64._0_4_ = (params->dist).alphabet_size_max;
    uVar64._4_4_ = (params->dist).alphabet_size_limit;
    uVar64 = (*(ulong *)(ringbuffer + uVar56) & uVar64) * 0x1fe35a7bd3579bd3 >>
             ((byte)(params->dist).distance_postfix_bits & 0x3f);
    uVar28 = uVar64 & 0xffffffff;
    uVar62 = (int)uVar64 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
    uVar7 = *(ushort *)(uVar14 + uVar28 * 2);
    uVar57 = (ulong)uVar7;
    piVar31 = &(params->hasher).num_last_distances_to_check;
    puVar27 = ringbuffer + uVar56;
    uVar64 = 0;
    if (*(ulong *)piVar31 <= uVar57) {
      uVar64 = uVar57 - *(long *)piVar31;
    }
    uVar65 = (ulong)(uVar38 & 7);
    do {
      if (uVar57 <= uVar64) break;
      uVar57 = uVar57 - 1;
      uVar55 = *(uint *)(puVar15 +
                        (ulong)uVar62 * 2 +
                        (ulong)((uint)(params->dist).max_distance & (uint)uVar57) * 2);
      pDVar51 = (DictWord *)((long)pDVar49 - (ulong)uVar55);
      if ((pDVar51 <= pDVar40) && (uVar59 + uVar56 <= ringbuffer_mask)) {
        uVar52 = (ulong)(uVar55 & uVar61);
        if ((uVar59 + uVar52 <= ringbuffer_mask) &&
           (ringbuffer[uVar59 + uVar56] == ringbuffer[uVar59 + uVar52])) {
          if (7 < local_130) {
            lVar60 = 0;
            uVar32 = 0;
LAB_0011f291:
            if (*(ulong *)(puVar27 + uVar32 * 8) == *(ulong *)(ringbuffer + uVar32 * 8 + uVar52))
            goto code_r0x0011f2a4;
            uVar32 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar52) ^ *(ulong *)(puVar27 + uVar32 * 8)
            ;
            uVar52 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            uVar32 = (uVar52 >> 3 & 0x1fffffff) - lVar60;
            goto LAB_0011f2d2;
          }
          uVar42 = 0;
          puVar30 = puVar27;
LAB_0011f354:
          uVar32 = uVar42;
          if (uVar65 != 0) {
            uVar66 = uVar65 | uVar42;
            uVar54 = uVar65;
            do {
              uVar32 = uVar42;
              if (ringbuffer[uVar42 + uVar52] != *puVar30) break;
              puVar30 = puVar30 + 1;
              uVar42 = uVar42 + 1;
              uVar54 = uVar54 - 1;
              uVar32 = uVar66;
            } while (uVar54 != 0);
          }
LAB_0011f2d2:
          if ((bVar67) &&
             ((undefined1 *)(long)(int)num_literals[(long)psVar50 * 2] < &pDVar49->len + uVar32)) {
            uVar32 = (long)(int)num_literals[(long)psVar50 * 2] - (long)pDVar49;
          }
          if (3 < uVar32) {
            iVar39 = 0x1f;
            if ((uint)pDVar51 != 0) {
              for (; (uint)pDVar51 >> iVar39 == 0; iVar39 = iVar39 + -1) {
              }
            }
            uVar52 = (ulong)(iVar39 * -0x1e + 0x780) + uVar32 * 0x87;
            if (local_100 < uVar52) {
              uVar59 = uVar32;
              local_128 = (DictWord *)uVar32;
              local_110 = pDVar51;
              local_100 = uVar52;
            }
          }
        }
      }
    } while (pDVar51 <= pDVar40);
    *(int *)(puVar15 +
            (ulong)uVar62 * 2 + (ulong)((uint)(params->dist).max_distance & (uint)uVar7) * 2) =
         (int)pDVar49;
    *(ushort *)(uVar14 + uVar28 * 2) = uVar7 + 1;
    bVar36 = false;
LAB_0011f3bd:
    iVar39 = 0;
    if (local_100 == 0x7e4) {
      if (back_refs_position == (size_t *)0x0) {
        lVar60 = *(long *)&(params->dictionary).num_transforms;
        if (*(ulong *)(lVar60 + 8) >> 7 <= *(ulong *)(lVar60 + 0x10)) {
          piVar31 = (int *)(ringbuffer + uVar56);
          uVar64 = (ulong)((uint)(*piVar31 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          lVar17 = *(long *)(literal_context_lut + 0x78);
          lVar58 = *(long *)(lVar60 + 8);
          iVar39 = 0;
          lVar41 = 0;
LAB_0012073b:
          lVar58 = lVar58 + 1;
          *(long *)(lVar60 + 8) = lVar58;
          bVar33 = *(byte *)(lVar17 + uVar64);
          uVar59 = (ulong)bVar33;
          if (uVar59 != 0) {
            bVar67 = true;
            if (uVar59 <= local_130) {
              uVar57 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar64 * 2);
              lVar18 = *(long *)(literal_context_lut + 0x58);
              pcVar35 = (char *)(uVar57 * uVar59 + *(long *)(lVar18 + 0xa8) +
                                (ulong)*(uint *)(lVar18 + 0x20 + uVar59 * 4));
              if (7 < bVar33) {
                uVar28 = (ulong)(bVar33 & 0xfffffff8);
                lVar53 = 0;
                uVar65 = 0;
LAB_001207a1:
                if (*(ulong *)(pcVar35 + uVar65 * 8) == *(ulong *)(piVar31 + uVar65 * 2))
                goto code_r0x001207b2;
                uVar65 = *(ulong *)(piVar31 + uVar65 * 2) ^ *(ulong *)(pcVar35 + uVar65 * 8);
                uVar28 = 0;
                if (uVar65 != 0) {
                  for (; (uVar65 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar65 = (uVar28 >> 3 & 0x1fffffff) - lVar53;
                goto LAB_001207f7;
              }
              uVar28 = 0;
              goto LAB_001208e0;
            }
            goto LAB_00120864;
          }
          goto LAB_00120871;
        }
      }
      else if ((bVar67) && (pDVar49 == (DictWord *)(long)(int)num_literals[(long)psVar50 * 2])) {
        uVar62 = (uint)num_literals[(long)psVar50 * 2 + 1];
        if (*(int *)((long)num_literals + (long)psVar50 * 0x10 + 0xc) < (int)uVar62) {
          uVar55 = *(uint *)((long)num_literals + (long)psVar50 * 0x10 + 4);
          uVar64 = (ulong)uVar55;
          if (uVar55 - 4 < 0x15 && (int)uVar62 < 0x7ffffffd) {
            uVar23 = ~(uint)pDVar40 + uVar62;
            lVar60 = *(long *)(literal_context_lut + 0x58);
            iVar37 = (int)uVar23 >> (*(byte *)(lVar60 + uVar64) & 0x1f);
            if (iVar37 < *(int *)(literal_context_lut + 0x60)) {
              uVar8 = *(uint *)(lVar60 + 0x20 + uVar64 * 4);
              uVar9 = kBitMask[*(byte *)(lVar60 + uVar64)];
              lVar60 = *(long *)(lVar60 + 0xa8);
              pBVar29 = BrotliGetTransforms();
              puVar27 = (uint8_t *)malloc(uVar64 * 10);
              iVar39 = BrotliTransformDictionaryWord
                                 (puVar27,(uint8_t *)
                                          ((ulong)uVar8 + lVar60 +
                                          (long)(int)((uVar23 & uVar9) * uVar55)),uVar55,pBVar29,
                                  iVar37);
              sVar63 = (size_t)iVar39;
              iVar37 = bcmp(ringbuffer + uVar56,puVar27,sVar63);
              if (iVar37 == 0) {
                iVar37 = 0x1f;
                if (uVar62 != 0) {
                  for (; uVar62 >> iVar37 == 0; iVar37 = iVar37 + -1) {
                  }
                }
                local_100 = (ulong)(iVar37 * -0x1e + 0x780) + sVar63 * 0x87;
                iVar39 = uVar55 - iVar39;
                local_110 = (DictWord *)(long)(int)uVar62;
                local_128 = (DictWord *)sVar63;
              }
              else {
                iVar39 = 0;
              }
            }
          }
          bVar36 = true;
        }
      }
    }
  }
LAB_0011f519:
  uVar64 = (ulong)local_128;
  if (0x1f < local_130) {
    pDVar48 = (params->dictionary).dict_words;
    if (pDVar48 <= pDVar49) {
      uVar62 = *(uint *)&(params->dictionary).hash_table_lengths;
      iVar37 = params[1].quality;
      iVar24 = params[1].lgwin;
      local_d8 = local_110;
LAB_0011f5b9:
      uVar55 = uVar62 & 0x3fffffff;
      bVar33 = ringbuffer[(ulong)pDVar48 & ringbuffer_mask];
      bVar6 = ringbuffer[(ulong)(pDVar48 + 8) & ringbuffer_mask];
      if (uVar55 < 0x1000000) {
        puVar15 = (params->dictionary).buckets;
        uVar23 = *(uint *)(puVar15 + (ulong)uVar55 * 2);
        *(int *)(puVar15 + (ulong)uVar55 * 2) = (int)pDVar48;
        if ((pDVar48 == pDVar49) && (uVar23 != 0xffffffff)) {
          uVar55 = (int)pDVar49 - uVar23;
          if ((DictWord *)(ulong)uVar55 <= pDVar40) {
            lVar60 = 0;
            uVar64 = 0;
LAB_0011f65d:
            if (*(ulong *)(ringbuffer + uVar64 * 8 + uVar56) ==
                *(ulong *)(ringbuffer + uVar64 * 8 + (ulong)(uVar23 & uVar61)))
            goto code_r0x0011f66f;
            uVar59 = *(ulong *)(ringbuffer + uVar64 * 8 + (ulong)(uVar23 & uVar61)) ^
                     *(ulong *)(ringbuffer + uVar64 * 8 + uVar56);
            uVar64 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
              }
            }
            uVar59 = (uVar64 >> 3 & 0x1fffffff) - lVar60;
            goto LAB_0011f6ba;
          }
        }
      }
      goto LAB_0011f622;
    }
    goto LAB_0011f739;
  }
  goto LAB_0011f763;
code_r0x0011f051:
  uVar52 = uVar52 + 1;
  lVar60 = lVar60 + -8;
  uVar32 = local_130 & 0xfffffffffffffff8;
  puVar30 = puVar27 + (local_130 & 0xfffffffffffffff8);
  if (local_130 >> 3 == uVar52) goto LAB_0011f119;
  goto LAB_0011f044;
code_r0x0011f2a4:
  uVar32 = uVar32 + 1;
  lVar60 = lVar60 + -8;
  uVar42 = local_130 & 0xfffffffffffffff8;
  puVar30 = puVar27 + (local_130 & 0xfffffffffffffff8);
  if (local_130 >> 3 == uVar32) goto LAB_0011f354;
  goto LAB_0011f291;
code_r0x00120979:
  uVar57 = uVar57 + 1;
  lVar60 = lVar60 + -8;
  if (local_130 >> 3 == uVar57) goto LAB_00120e54;
  goto LAB_0012096c;
code_r0x001207b2:
  uVar65 = uVar65 + 1;
  lVar53 = lVar53 + -8;
  if (bVar33 >> 3 == uVar65) goto code_r0x001207be;
  goto LAB_001207a1;
code_r0x001207be:
  pcVar35 = pcVar35 + -lVar53;
LAB_001208e0:
  uVar52 = uVar59 & 7;
  uVar65 = uVar28;
  if ((bVar33 & 7) != 0) {
    uVar32 = uVar28 | uVar52;
    do {
      uVar65 = uVar28;
      if (*(char *)((long)piVar31 + uVar28) != *pcVar35) break;
      pcVar35 = pcVar35 + 1;
      uVar28 = uVar28 + 1;
      uVar52 = uVar52 - 1;
      uVar65 = uVar32;
    } while (uVar52 != 0);
  }
LAB_001207f7:
  if (((uVar65 == 0) || (*(uint *)(literal_context_lut + 100) + uVar65 <= uVar59)) ||
     (pDVar51 = (DictWord *)
                (&pDVar48->transform +
                ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                               ((char)(uVar59 - uVar65) * '\x06' & 0x3fU)) & 0x3f) +
                 (uVar59 - uVar65) * 4 << (*(byte *)(lVar18 + uVar59) & 0x3f)) + uVar57),
     pDVar44 < pDVar51)) {
    bVar67 = true;
  }
  else {
    iVar37 = 0x1f;
    if ((uint)pDVar51 != 0) {
      for (; (uint)pDVar51 >> iVar37 == 0; iVar37 = iVar37 + -1) {
      }
    }
    uVar59 = (uVar65 * 0x87 - (ulong)(uint)(iVar37 * 0x1e)) + 0x780;
    bVar67 = true;
    if (local_100 <= uVar59) {
      iVar39 = (uint)bVar33 - (int)uVar65;
      bVar67 = false;
      local_128 = (DictWord *)uVar65;
      local_110 = pDVar51;
      local_100 = uVar59;
    }
  }
LAB_00120864:
  if (!bVar67) {
    *(long *)(lVar60 + 0x10) = *(long *)(lVar60 + 0x10) + 1;
  }
LAB_00120871:
  uVar64 = uVar64 + 1;
  bVar67 = lVar41 != 0;
  lVar41 = lVar41 + 1;
  if (bVar67) goto LAB_0011f519;
  goto LAB_0012073b;
code_r0x0011f66f:
  uVar64 = uVar64 + 1;
  lVar60 = lVar60 + -8;
  uVar59 = local_130 & 0xfffffffffffffff8;
  uVar57 = local_130 & 0xfffffffffffffff8;
  uVar28 = (ulong)(uVar38 & 7);
  if (local_130 >> 3 == uVar64) goto joined_r0x0011f685;
  goto LAB_0011f65d;
joined_r0x0011f685:
  for (; (uVar28 != 0 &&
         (uVar59 = uVar57, ringbuffer[uVar57 + (uVar23 & uVar61)] == ringbuffer[uVar57 + uVar56]));
      uVar57 = uVar57 + 1) {
    uVar59 = local_130;
    uVar28 = uVar28 - 1;
  }
LAB_0011f6ba:
  if ((3 < uVar59) && (local_128 < uVar59)) {
    iVar46 = 0x1f;
    if (uVar55 != 0) {
      for (; uVar55 >> iVar46 == 0; iVar46 = iVar46 + -1) {
      }
    }
    uVar64 = (ulong)(iVar46 * -0x1e + 0x780) + uVar59 * 0x87;
    if (local_100 < uVar64) {
      iVar39 = 0;
      local_128 = (DictWord *)uVar59;
      local_100 = uVar64;
      local_d8 = (DictWord *)(ulong)uVar55;
    }
  }
LAB_0011f622:
  uVar62 = ~(uint)bVar33 * iVar24 + (uint)bVar6 + uVar62 * iVar37 + 1;
  pDVar48 = (DictWord *)&pDVar48->transform;
  if (pDVar49 < pDVar48) goto LAB_0011f71e;
  goto LAB_0011f5b9;
LAB_0011f71e:
  *(uint *)&(params->dictionary).hash_table_lengths = uVar62;
  local_110 = local_d8;
LAB_0011f739:
  (params->dictionary).dict_words = (DictWord *)&pDVar49->transform;
  uVar64 = (ulong)local_128;
LAB_0011f763:
  if (local_100 < 0x7e5) {
    local_c0 = local_c0 + 1;
    position = (size_t)&pDVar49->transform;
    if ((back_refs_position == (size_t *)0x0) && (local_a0 < position)) {
      if (local_a0 + (uint)((int)lVar34 * 4) < position) {
        pDVar40 = (DictWord *)&pDVar49[4].transform;
        if (puVar1 <= &pDVar49[4].transform) {
          pDVar40 = (DictWord *)puVar1;
        }
        if (position < pDVar40) {
          uVar14 = (params->dictionary).cutoffTransforms;
          puVar15 = (params->dictionary).hash_table_words;
          uVar59._0_4_ = (params->dist).alphabet_size_max;
          uVar59._4_4_ = (params->dist).alphabet_size_limit;
          uVar11 = (params->dist).distance_postfix_bits;
          sVar22 = (params->dist).max_distance;
          uVar12 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
          do {
            uVar64 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar59) *
                     0x1fe35a7bd3579bd3 >> ((byte)uVar11 & 0x3f);
            uVar56 = uVar64 & 0xffffffff;
            uVar7 = *(ushort *)(uVar14 + uVar56 * 2);
            *(ushort *)(uVar14 + uVar56 * 2) = uVar7 + 1;
            *(int *)(puVar15 +
                    (ulong)((uint)sVar22 & (uint)uVar7) * 2 +
                    (ulong)(uint)((int)uVar64 << ((byte)uVar12 & 0x1f)) * 2) = (int)position;
            local_c0 = local_c0 + 4;
            position = position + 4;
          } while (position < pDVar40);
        }
      }
      else {
        puVar27 = &pDVar49[2].transform;
        if (puVar1 <= &pDVar49[2].transform) {
          puVar27 = puVar1;
        }
        if (position < puVar27) {
          uVar14 = (params->dictionary).cutoffTransforms;
          puVar15 = (params->dictionary).hash_table_words;
          uVar56._0_4_ = (params->dist).alphabet_size_max;
          uVar56._4_4_ = (params->dist).alphabet_size_limit;
          uVar11 = (params->dist).distance_postfix_bits;
          sVar22 = (params->dist).max_distance;
          uVar12 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
          do {
            uVar59 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar56) *
                     0x1fe35a7bd3579bd3 >> ((byte)uVar11 & 0x3f);
            uVar64 = uVar59 & 0xffffffff;
            uVar7 = *(ushort *)(uVar14 + uVar64 * 2);
            *(ushort *)(uVar14 + uVar64 * 2) = uVar7 + 1;
            *(int *)(puVar15 +
                    (ulong)((uint)sVar22 & (uint)uVar7) * 2 +
                    (ulong)(uint)((int)uVar59 << ((byte)uVar12 & 0x1f)) * 2) = (int)position;
            local_c0 = local_c0 + 2;
            position = position + 2;
          } while (position < puVar27);
        }
      }
    }
    goto LAB_00120dc6;
  }
  local_d8 = local_110;
  if (!bVar36) {
    uVar14 = (params->dictionary).cutoffTransforms;
    puVar15 = (params->dictionary).hash_table_words;
    uVar56 = (lVar4 + num_bytes) - (long)pDVar49;
    iVar37 = 0;
LAB_0011f8e9:
    uVar57 = uVar56 >> 3;
    local_130 = local_130 - 1;
    uVar59 = uVar64 - 1;
    if (local_130 <= uVar64 - 1) {
      uVar59 = local_130;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar59 = 0;
    }
    puVar27 = &pDVar49->transform;
    pDVar40 = pDVar5;
    if (puVar27 < pDVar5) {
      pDVar40 = (DictWord *)puVar27;
    }
    pDVar48 = (DictWord *)(&pDVar49->transform + lVar13);
    if (pDVar5 <= (DictWord *)(&pDVar49->transform + lVar13)) {
      pDVar48 = pDVar5;
    }
    pDVar44 = *(DictWord **)(literal_context_lut + 0x50);
    uVar28 = (ulong)puVar27 & ringbuffer_mask;
    psVar50 = *(size_t **)backward_references;
    bVar67 = psVar50 < back_refs_position;
    uVar38 = (uint)local_130;
    if (!bVar67) {
LAB_0011fa67:
      uVar65 = (ulong)*(int *)&(params->dictionary).words;
      if (uVar65 != 0) {
        puVar30 = ringbuffer + uVar28;
        local_158 = 0x7e4;
        uVar52 = 0;
        local_110 = (DictWord *)0x0;
        local_128 = (DictWord *)0x0;
LAB_0011fac2:
        pDVar51 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + uVar52 * 4);
        if (((pDVar51 <= pDVar40) && (puVar27 + -(long)pDVar51 < puVar27)) &&
           (uVar28 + uVar59 <= ringbuffer_mask)) {
          uVar32 = (ulong)(puVar27 + -(long)pDVar51) & ringbuffer_mask;
          if ((ringbuffer_mask < uVar32 + uVar59) ||
             (ringbuffer[uVar28 + uVar59] != ringbuffer[uVar32 + uVar59])) goto LAB_0011fbee;
          uVar42 = (ulong)(uVar38 & 7);
          if (7 < local_130) {
            lVar60 = 0;
            uVar54 = 0;
LAB_0011fb28:
            if (*(ulong *)(puVar30 + uVar54 * 8) == *(ulong *)(ringbuffer + uVar54 * 8 + uVar32))
            goto code_r0x0011fb3a;
            uVar42 = *(ulong *)(ringbuffer + uVar54 * 8 + uVar32) ^ *(ulong *)(puVar30 + uVar54 * 8)
            ;
            uVar32 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            uVar54 = (uVar32 >> 3 & 0x1fffffff) - lVar60;
            goto LAB_0011fb6b;
          }
          uVar54 = 0;
          puVar21 = puVar30;
          goto joined_r0x0011fc0b;
        }
        goto LAB_0011fbee;
      }
      local_158 = 0x7e4;
      local_128 = (DictWord *)0x0;
      local_110 = (DictWord *)0x0;
LAB_0011fc4a:
      uVar65._0_4_ = (params->dist).alphabet_size_max;
      uVar65._4_4_ = (params->dist).alphabet_size_limit;
      uVar65 = (*(ulong *)(ringbuffer + uVar28) & uVar65) * 0x1fe35a7bd3579bd3 >>
               ((byte)(params->dist).distance_postfix_bits & 0x3f);
      uVar32 = uVar65 & 0xffffffff;
      uVar62 = (int)uVar65 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
      puVar30 = ringbuffer + uVar28;
      uVar7 = *(ushort *)(uVar14 + uVar32 * 2);
      uVar52 = (ulong)uVar7;
      piVar31 = &(params->hasher).num_last_distances_to_check;
      uVar65 = 0;
      if (*(ulong *)piVar31 <= uVar52) {
        uVar65 = uVar52 - *(long *)piVar31;
      }
LAB_0011fcde:
      if (uVar65 < uVar52) {
        uVar52 = uVar52 - 1;
        uVar55 = *(uint *)(puVar15 +
                          (ulong)uVar62 * 2 +
                          (ulong)((uint)(params->dist).max_distance & (uint)uVar52) * 2);
        pDVar51 = (DictWord *)(puVar27 + -(ulong)uVar55);
        if ((pDVar51 <= pDVar40) && (uVar28 + uVar59 <= ringbuffer_mask)) {
          uVar42 = (ulong)(uVar55 & uVar61);
          if ((ringbuffer_mask < uVar42 + uVar59) ||
             (ringbuffer[uVar28 + uVar59] != ringbuffer[uVar42 + uVar59])) goto LAB_0011fd7d;
          uVar54 = (ulong)(uVar38 & 7);
          if (7 < local_130) {
            lVar60 = 0;
            uVar66 = 0;
LAB_0011fd3c:
            if (*(ulong *)(puVar30 + uVar66 * 8) == *(ulong *)(ringbuffer + uVar66 * 8 + uVar42))
            goto code_r0x0011fd4e;
            uVar54 = *(ulong *)(ringbuffer + uVar66 * 8 + uVar42) ^ *(ulong *)(puVar30 + uVar66 * 8)
            ;
            uVar42 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
              }
            }
            uVar66 = (uVar42 >> 3 & 0x1fffffff) - lVar60;
            goto LAB_0011fd99;
          }
          uVar66 = 0;
          puVar21 = puVar30;
          goto joined_r0x0011fe1d;
        }
        goto LAB_0011fd7d;
      }
      goto LAB_0011fe40;
    }
    if ((undefined1 *)(long)(int)num_literals[(long)psVar50 * 2] < puVar27) {
      psVar47 = num_literals + (long)psVar50 * 2 + 2;
      do {
        psVar50 = (size_t *)((long)psVar50 + 1);
        if (back_refs_position == psVar50) {
          *(size_t **)backward_references = psVar50;
          bVar67 = false;
          psVar50 = back_refs_position;
          goto LAB_0011fa67;
        }
        sVar22 = *psVar47;
        psVar47 = psVar47 + 2;
      } while ((undefined1 *)(long)(int)sVar22 < puVar27);
      *(size_t **)backward_references = psVar50;
      bVar67 = psVar50 < back_refs_position;
    }
    if ((!bVar67) || (puVar27 != (undefined1 *)(long)(int)num_literals[(long)psVar50 * 2]))
    goto LAB_0011fa67;
    uVar62 = (uint)num_literals[(long)psVar50 * 2 + 1];
    local_128 = (DictWord *)(long)(int)uVar62;
    local_158 = 0x7e4;
    iVar24 = 0;
    bVar20 = true;
    if ((puVar27 + -(long)local_128 < puVar27) &&
       (uVar62 <= *(uint *)((long)num_literals + (long)psVar50 * 0x10 + 0xc))) {
      uVar59 = (ulong)(puVar27 + -(long)local_128) & ringbuffer_mask;
      puVar30 = ringbuffer + uVar28;
      if (7 < local_130) {
        lVar60 = 0;
        uVar65 = 0;
LAB_00120522:
        if (*(ulong *)(puVar30 + uVar65 * 8) == *(ulong *)(ringbuffer + uVar65 * 8 + uVar59))
        goto code_r0x0012052f;
        uVar65 = *(ulong *)(ringbuffer + uVar65 * 8 + uVar59) ^ *(ulong *)(puVar30 + uVar65 * 8);
        uVar59 = 0;
        if (uVar65 != 0) {
          for (; (uVar65 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
          }
        }
        uVar65 = (uVar59 >> 3 & 0x1fffffff) - lVar60;
        goto LAB_0012055b;
      }
      uVar65 = 0;
      goto LAB_0012061f;
    }
    bVar36 = false;
    local_128 = (DictWord *)0x0;
    local_110 = (DictWord *)0x0;
    goto LAB_0012059b;
  }
LAB_0011f787:
  pDVar40 = (DictWord *)(&pDVar49->len + lVar13);
  if (pDVar5 <= (DictWord *)(&pDVar49->len + lVar13)) {
    pDVar40 = pDVar5;
  }
  if (pDVar40 < local_d8) {
LAB_00120a60:
    puVar45 = (undefined1 *)((long)&local_d8[3].idx + 1);
  }
  else {
    pDVar48 = (DictWord *)(long)*(int *)&(hasher->common).extra;
    uVar38 = 0;
    bVar67 = false;
    if (local_d8 != pDVar48) {
      pDVar44 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + 4);
      if (local_d8 == pDVar44) {
        uVar38 = 1;
      }
      else {
        uVar56 = (long)local_d8 + (3 - (long)pDVar48);
        if (uVar56 < 7) {
          bVar33 = (byte)((int)uVar56 << 2);
          uVar38 = 0x9750468;
        }
        else {
          uVar56 = (long)local_d8 + (3 - (long)pDVar44);
          if (6 < uVar56) {
            if (local_d8 != (DictWord *)(long)(int)(hasher->common).dict_num_lookups) {
              bVar67 = local_d8 !=
                       (DictWord *)(long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
              uVar38 = 3;
              goto LAB_00120a5c;
            }
            uVar38 = 2;
            goto LAB_00120a5a;
          }
          bVar33 = (byte)((int)uVar56 << 2);
          uVar38 = 0xfdb1ace;
        }
        uVar38 = uVar38 >> (bVar33 & 0x1f) & 0xf;
      }
LAB_00120a5a:
      bVar67 = false;
    }
LAB_00120a5c:
    if (bVar67) goto LAB_00120a60;
    puVar45 = (undefined1 *)(ulong)uVar38;
  }
  if ((local_d8 <= pDVar40) && (puVar45 != (undefined1 *)0x0)) {
    (hasher->common).dict_num_lookups = *(size_t *)((long)&(hasher->common).extra + 4);
    iVar37 = *(int *)&(hasher->common).extra;
    *(int *)((long)&(hasher->common).extra + 4) = iVar37;
    iVar46 = (int)local_d8;
    *(int *)&(hasher->common).extra = iVar46;
    iVar24 = *(int *)&(params->dictionary).words;
    if (4 < iVar24) {
      *(int *)&(hasher->common).dict_num_matches = iVar46 + -1;
      *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar46 + 1;
      (hasher->common).params.type = iVar46 + -2;
      (hasher->common).params.bucket_bits = iVar46 + 2;
      (hasher->common).params.block_bits = iVar46 + -3;
      (hasher->common).params.hash_len = iVar46 + 3;
      if (10 < iVar24) {
        (hasher->common).params.num_last_distances_to_check = iVar37 + -1;
        (hasher->common).is_prepared_ = iVar37 + 1;
        *(int *)&hasher->privat = iVar37 + -2;
        *(int *)((long)&hasher->privat + 4) = iVar37 + 2;
        *(int *)((long)&hasher->privat + 8) = iVar37 + -3;
        *(int *)((long)&hasher->privat + 0xc) = iVar37 + 3;
      }
    }
  }
  uVar38 = (uint)local_c0;
  *(uint *)local_b0 = uVar38;
  *(uint *)((long)local_b0 + 4) = iVar39 << 0x19 | (uint)uVar64;
  puVar2 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x44) + 0x10);
  if (puVar45 < puVar2) {
    *(short *)((long)local_b0 + 0xe) = (short)puVar45;
    uVar61 = 0;
  }
  else {
    bVar33 = (byte)*(int *)(literal_context_lut + 0x40);
    puVar45 = puVar45 + ((4L << (bVar33 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x44)) +
                        -0x10;
    uVar61 = 0x1f;
    if ((uint)puVar45 != 0) {
      for (; (uint)puVar45 >> uVar61 == 0; uVar61 = uVar61 - 1) {
      }
    }
    uVar61 = (uVar61 ^ 0xffffffe0) + 0x1f;
    bVar67 = ((ulong)puVar45 >> ((ulong)uVar61 & 0x3f) & 1) != 0;
    iVar37 = uVar61 - *(int *)(literal_context_lut + 0x40);
    *(ushort *)((long)local_b0 + 0xe) =
         (short)((uint)bVar67 + iVar37 * 2 + 0xfffe << (bVar33 & 0x3f)) +
         (short)puVar2 + (~(ushort)(-1 << (bVar33 & 0x1f)) & (ushort)puVar45) |
         (short)iVar37 * 0x400;
    uVar61 = (uint)((long)puVar45 - ((ulong)bVar67 + 2 << ((byte)uVar61 & 0x3f)) >> (bVar33 & 0x3f))
    ;
  }
  *(uint *)(local_b0 + 1) = uVar61;
  if (5 < local_c0) {
    if (local_c0 < 0x82) {
      uVar38 = 0x1f;
      uVar61 = (uint)(local_c0 - 2);
      if (uVar61 != 0) {
        for (; uVar61 >> uVar38 == 0; uVar38 = uVar38 - 1) {
        }
      }
      uVar38 = (int)(local_c0 - 2 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar38 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_c0 < 0x842) {
      uVar61 = 0x1f;
      if (uVar38 - 0x42 != 0) {
        for (; uVar38 - 0x42 >> uVar61 == 0; uVar61 = uVar61 - 1) {
        }
      }
      uVar38 = (uVar61 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar38 = 0x15;
      if (0x1841 < local_c0) {
        uVar38 = (uint)(ushort)(0x17 - (local_c0 < 0x5842));
      }
    }
  }
  uVar61 = iVar39 + (uint)uVar64;
  if (uVar61 < 10) {
    uVar62 = uVar61 - 2;
  }
  else if (uVar61 < 0x86) {
    uVar61 = uVar61 - 6;
    uVar62 = 0x1f;
    if (uVar61 != 0) {
      for (; uVar61 >> uVar62 == 0; uVar62 = uVar62 - 1) {
      }
    }
    uVar62 = (int)((ulong)(long)(int)uVar61 >> ((char)(uVar62 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar62 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar62 = 0x17;
    if (uVar61 < 0x846) {
      uVar62 = 0x1f;
      if (uVar61 - 0x46 != 0) {
        for (; uVar61 - 0x46 >> uVar62 == 0; uVar62 = uVar62 - 1) {
        }
      }
      uVar62 = (uVar62 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar62;
  uVar43 = (uVar7 & 7) + ((ushort)uVar38 & 7) * 8;
  if ((((*(ushort *)((long)local_b0 + 0xe) & 0x3ff) == 0) && ((ushort)uVar38 < 8)) && (uVar7 < 0x10)
     ) {
    if (7 < uVar7) {
      uVar43 = uVar43 | 0x40;
    }
  }
  else {
    iVar39 = ((uVar38 & 0xffff) >> 3) * 3 + ((uVar62 & 0xffff) >> 3);
    uVar43 = uVar43 + ((ushort)(0x520d40 >> ((char)iVar39 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar39 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_b0 + 0xc) = uVar43;
  *num_commands = *num_commands + local_c0;
  position = (size_t)(&pDVar49->len + uVar64);
  pDVar40 = pDVar25;
  if (position < pDVar25) {
    pDVar40 = (DictWord *)position;
  }
  pDVar48 = (DictWord *)&pDVar49->idx;
  if (local_d8 < (DictWord *)(uVar64 >> 2)) {
    pDVar44 = (DictWord *)(position + -(long)local_d8 * 4);
    if ((DictWord *)(position + -(long)local_d8 * 4) < pDVar48) {
      pDVar44 = pDVar48;
    }
    pDVar48 = pDVar44;
    if (pDVar40 < pDVar44) {
      pDVar48 = pDVar40;
    }
  }
  local_a0 = &pDVar49->len + lVar34 + uVar64 * 2;
  local_b0 = local_b0 + 2;
  if (pDVar48 < pDVar40) {
    uVar14 = (params->dictionary).cutoffTransforms;
    puVar15 = (params->dictionary).hash_table_words;
    uVar57._0_4_ = (params->dist).alphabet_size_max;
    uVar57._4_4_ = (params->dist).alphabet_size_limit;
    uVar11 = (params->dist).distance_postfix_bits;
    sVar22 = (params->dist).max_distance;
    uVar12 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
    do {
      uVar64 = (*(ulong *)(ringbuffer + ((ulong)pDVar48 & ringbuffer_mask)) & uVar57) *
               0x1fe35a7bd3579bd3 >> ((byte)uVar11 & 0x3f);
      uVar56 = uVar64 & 0xffffffff;
      uVar7 = *(ushort *)(uVar14 + uVar56 * 2);
      *(ushort *)(uVar14 + uVar56 * 2) = uVar7 + 1;
      *(int *)(puVar15 +
              (ulong)((uint)sVar22 & (uint)uVar7) * 2 +
              (ulong)(uint)((int)uVar64 << ((byte)uVar12 & 0x1f)) * 2) = (int)pDVar48;
      pDVar48 = (DictWord *)&pDVar48->transform;
    } while (pDVar40 != pDVar48);
    local_c0 = 0;
  }
  else {
    local_c0 = 0;
  }
LAB_00120dc6:
  pDVar49 = (DictWord *)position;
  if (pDVar3 <= (DictWord *)(position + 8)) goto LAB_00120e92;
  goto LAB_0011ee21;
code_r0x0011fb3a:
  uVar54 = uVar54 + 1;
  lVar60 = lVar60 + -8;
  if (uVar57 == uVar54) goto code_r0x0011fb4b;
  goto LAB_0011fb28;
code_r0x0011fb4b:
  uVar54 = -lVar60;
  puVar21 = puVar30 + -lVar60;
joined_r0x0011fc0b:
  for (; (uVar42 != 0 && (ringbuffer[uVar54 + uVar32] == *puVar21)); uVar54 = uVar54 + 1) {
    uVar42 = uVar42 - 1;
    puVar21 = puVar21 + 1;
  }
LAB_0011fb6b:
  if ((bVar67) && ((undefined1 *)(long)(int)num_literals[(long)psVar50 * 2] < puVar27 + uVar54)) {
    uVar54 = (long)(int)num_literals[(long)psVar50 * 2] - (long)puVar27;
  }
  if (((2 < uVar54) || ((uVar52 < 2 && (uVar54 == 2)))) &&
     (uVar32 = uVar54 * 0x87 + 0x78f, local_158 < uVar32)) {
    if (uVar52 != 0) {
      uVar32 = uVar32 - ((0x1ca10U >> ((byte)uVar52 & 0xe) & 0xe) + 0x27);
    }
    if (local_158 < uVar32) {
      uVar59 = uVar54;
      local_158 = uVar32;
      local_128 = pDVar51;
      local_110 = (DictWord *)uVar54;
    }
  }
LAB_0011fbee:
  uVar52 = uVar52 + 1;
  if (uVar52 == uVar65) goto LAB_0011fc4a;
  goto LAB_0011fac2;
code_r0x0011fd4e:
  uVar66 = uVar66 + 1;
  lVar60 = lVar60 + -8;
  if (uVar57 == uVar66) goto code_r0x0011fd5f;
  goto LAB_0011fd3c;
code_r0x0011fd5f:
  uVar66 = -lVar60;
  puVar21 = puVar30 + -lVar60;
joined_r0x0011fe1d:
  for (; (uVar54 != 0 && (ringbuffer[uVar66 + uVar42] == *puVar21)); uVar66 = uVar66 + 1) {
    uVar54 = uVar54 - 1;
    puVar21 = puVar21 + 1;
  }
LAB_0011fd99:
  if ((bVar67) && ((undefined1 *)(long)(int)num_literals[(long)psVar50 * 2] < puVar27 + uVar66)) {
    uVar66 = (long)(int)num_literals[(long)psVar50 * 2] - (long)puVar27;
  }
  if (3 < uVar66) {
    iVar24 = 0x1f;
    if ((uint)pDVar51 != 0) {
      for (; (uint)pDVar51 >> iVar24 == 0; iVar24 = iVar24 + -1) {
      }
    }
    uVar42 = (ulong)(iVar24 * -0x1e + 0x780) + uVar66 * 0x87;
    if (local_158 < uVar42) {
      uVar59 = uVar66;
      local_158 = uVar42;
      local_128 = pDVar51;
      local_110 = (DictWord *)uVar66;
    }
  }
LAB_0011fd7d:
  if (pDVar40 < pDVar51) goto LAB_0011fe40;
  goto LAB_0011fcde;
LAB_0011fe40:
  *(int *)(puVar15 +
          (ulong)uVar62 * 2 + (ulong)((uint)(params->dist).max_distance & (uint)uVar7) * 2) =
       (int)puVar27;
  *(ushort *)(uVar14 + uVar32 * 2) = uVar7 + 1;
  bVar36 = false;
LAB_0011fe79:
  iVar24 = 0;
  if (local_158 == 0x7e4) {
    if (back_refs_position == (size_t *)0x0) {
      lVar60 = *(long *)&(params->dictionary).num_transforms;
      if (*(ulong *)(lVar60 + 8) >> 7 <= *(ulong *)(lVar60 + 0x10)) {
        piVar31 = (int *)(ringbuffer + uVar28);
        uVar59 = (ulong)((uint)(*piVar31 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar17 = *(long *)(literal_context_lut + 0x78);
        lVar58 = *(long *)(lVar60 + 8);
        iVar24 = 0;
        lVar41 = 0;
LAB_00120316:
        lVar58 = lVar58 + 1;
        *(long *)(lVar60 + 8) = lVar58;
        bVar33 = *(byte *)(lVar17 + uVar59);
        uVar65 = (ulong)bVar33;
        if (uVar65 != 0) {
          bVar67 = true;
          if (uVar65 <= local_130) {
            uVar52 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar59 * 2);
            lVar18 = *(long *)(literal_context_lut + 0x58);
            pcVar35 = (char *)(uVar52 * uVar65 + *(long *)(lVar18 + 0xa8) +
                              (ulong)*(uint *)(lVar18 + 0x20 + uVar65 * 4));
            if (7 < bVar33) {
              uVar42 = (ulong)(bVar33 & 0xfffffff8);
              lVar53 = 0;
              uVar32 = 0;
LAB_00120382:
              if (*(ulong *)(pcVar35 + uVar32 * 8) == *(ulong *)(piVar31 + uVar32 * 2))
              goto code_r0x00120394;
              uVar42 = *(ulong *)(piVar31 + uVar32 * 2) ^ *(ulong *)(pcVar35 + uVar32 * 8);
              uVar32 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar53;
              goto LAB_001203cf;
            }
            uVar42 = 0;
            goto LAB_0012049d;
          }
          goto LAB_0012042d;
        }
        goto LAB_00120435;
      }
    }
    else if ((bVar67) && (puVar27 == (undefined1 *)(long)(int)num_literals[(long)psVar50 * 2])) {
      uVar62 = (uint)num_literals[(long)psVar50 * 2 + 1];
      if (*(int *)((long)num_literals + (long)psVar50 * 0x10 + 0xc) < (int)uVar62) {
        uVar55 = *(uint *)((long)num_literals + (long)psVar50 * 0x10 + 4);
        uVar59 = (ulong)uVar55;
        bVar36 = true;
        if (uVar55 - 4 < 0x15 && (int)uVar62 < 0x7ffffffd) {
          uVar23 = ~(uint)pDVar40 + uVar62;
          lVar60 = *(long *)(literal_context_lut + 0x58);
          iVar46 = (int)uVar23 >> (*(byte *)(lVar60 + uVar59) & 0x1f);
          if (iVar46 < *(int *)(literal_context_lut + 0x60)) {
            uVar8 = *(uint *)(lVar60 + 0x20 + uVar59 * 4);
            uVar9 = kBitMask[*(byte *)(lVar60 + uVar59)];
            lVar60 = *(long *)(lVar60 + 0xa8);
            pBVar29 = BrotliGetTransforms();
            puVar30 = (uint8_t *)malloc(uVar59 * 10);
            iVar24 = BrotliTransformDictionaryWord
                               (puVar30,(uint8_t *)
                                        ((ulong)uVar8 + lVar60 +
                                        (long)(int)((uVar23 & uVar9) * uVar55)),uVar55,pBVar29,
                                iVar46);
            sVar63 = (size_t)iVar24;
            iVar46 = bcmp(ringbuffer + uVar28,puVar30,sVar63);
            if (iVar46 == 0) {
              iVar46 = 0x1f;
              if (uVar62 != 0) {
                for (; uVar62 >> iVar46 == 0; iVar46 = iVar46 + -1) {
                }
              }
              local_158 = (ulong)(iVar46 * -0x1e + 0x780) + sVar63 * 0x87;
              iVar24 = uVar55 - iVar24;
              local_128 = (DictWord *)(long)(int)uVar62;
              local_110 = (DictWord *)sVar63;
            }
            else {
              iVar24 = 0;
            }
          }
        }
      }
    }
  }
  goto LAB_00120014;
code_r0x0012052f:
  uVar65 = uVar65 + 1;
  lVar60 = lVar60 + -8;
  if (uVar57 == uVar65) goto code_r0x00120540;
  goto LAB_00120522;
code_r0x00120540:
  puVar30 = puVar30 + -lVar60;
  uVar65 = -lVar60;
LAB_0012061f:
  uVar52 = local_130 & 7;
  for (; (uVar52 != 0 && (ringbuffer[uVar65 + uVar59] == *puVar30)); uVar65 = uVar65 + 1) {
    puVar30 = puVar30 + 1;
    uVar52 = uVar52 - 1;
  }
LAB_0012055b:
  local_110 = (DictWord *)(long)*(int *)((long)num_literals + (long)psVar50 * 0x10 + 4);
  if (uVar65 < local_110) {
    local_110 = (DictWord *)uVar65;
  }
  iVar46 = 0x1f;
  if (uVar62 != 0) {
    for (; uVar62 >> iVar46 == 0; iVar46 = iVar46 + -1) {
    }
  }
  local_158 = (ulong)(iVar46 * -0x1e + 0x780) + (long)local_110 * 0x87;
  bVar36 = true;
  bVar20 = false;
LAB_0012059b:
  if (bVar20) goto LAB_0011fe79;
LAB_00120014:
  local_e8 = local_128;
  local_140 = (ulong)local_110;
  if (0x1f < local_130) {
    pDVar48 = (params->dictionary).dict_words;
    if (pDVar48 <= puVar27) {
      uVar62 = *(uint *)&(params->dictionary).hash_table_lengths;
      iVar46 = params[1].quality;
      iVar10 = params[1].lgwin;
LAB_00120079:
      uVar55 = uVar62 & 0x3fffffff;
      bVar33 = ringbuffer[(ulong)pDVar48 & ringbuffer_mask];
      bVar6 = ringbuffer[(ulong)(pDVar48 + 8) & ringbuffer_mask];
      if (uVar55 < 0x1000000) {
        puVar16 = (params->dictionary).buckets;
        uVar23 = *(uint *)(puVar16 + (ulong)uVar55 * 2);
        *(int *)(puVar16 + (ulong)uVar55 * 2) = (int)pDVar48;
        if ((pDVar48 == (DictWord *)puVar27) && (uVar23 != 0xffffffff)) {
          uVar55 = (int)puVar27 - uVar23;
          if ((DictWord *)(ulong)uVar55 <= pDVar40) {
            lVar60 = 0;
            uVar59 = 0;
LAB_001200ed:
            if (*(ulong *)(ringbuffer + uVar59 * 8 + uVar28) ==
                *(ulong *)(ringbuffer + uVar59 * 8 + (ulong)(uVar23 & uVar61)))
            goto code_r0x001200ff;
            uVar65 = *(ulong *)(ringbuffer + uVar59 * 8 + (ulong)(uVar23 & uVar61)) ^
                     *(ulong *)(ringbuffer + uVar59 * 8 + uVar28);
            uVar59 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
              }
            }
            uVar59 = (uVar59 >> 3 & 0x1fffffff) - lVar60;
            goto LAB_00120145;
          }
        }
      }
      goto LAB_001201b3;
    }
LAB_00120201:
    (params->dictionary).dict_words = (DictWord *)&pDVar49->idx;
  }
  bVar67 = true;
  if ((bVar36) || (local_100 + 0xaf <= local_158)) {
    local_c0 = local_c0 + 1;
    bVar67 = (2 < iVar37 || bVar36) || pDVar3 <= &pDVar49[2].transform;
    local_d8 = local_e8;
    uVar64 = local_140;
    local_100 = local_158;
    pDVar49 = (DictWord *)puVar27;
    iVar39 = iVar24;
    iVar37 = iVar37 + 1;
  }
  uVar56 = uVar56 - 1;
  if (bVar67) goto LAB_0011f787;
  goto LAB_0011f8e9;
code_r0x00120394:
  uVar32 = uVar32 + 1;
  lVar53 = lVar53 + -8;
  if (bVar33 >> 3 == uVar32) goto code_r0x001203a0;
  goto LAB_00120382;
code_r0x001203a0:
  pcVar35 = pcVar35 + -lVar53;
LAB_0012049d:
  uVar54 = uVar65 & 7;
  uVar32 = uVar42;
  if ((bVar33 & 7) != 0) {
    uVar66 = uVar42 | uVar54;
    do {
      uVar32 = uVar42;
      if (*(char *)((long)piVar31 + uVar42) != *pcVar35) break;
      pcVar35 = pcVar35 + 1;
      uVar42 = uVar42 + 1;
      uVar54 = uVar54 - 1;
      uVar32 = uVar66;
    } while (uVar54 != 0);
  }
LAB_001203cf:
  if (((uVar32 == 0) || (*(uint *)(literal_context_lut + 100) + uVar32 <= uVar65)) ||
     (pDVar51 = (DictWord *)
                (&pDVar48->transform +
                ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                               ((char)(uVar65 - uVar32) * '\x06' & 0x3fU)) & 0x3f) +
                 (uVar65 - uVar32) * 4 << (*(byte *)(lVar18 + uVar65) & 0x3f)) + uVar52),
     pDVar44 < pDVar51)) {
    bVar67 = true;
  }
  else {
    iVar46 = 0x1f;
    if ((uint)pDVar51 != 0) {
      for (; (uint)pDVar51 >> iVar46 == 0; iVar46 = iVar46 + -1) {
      }
    }
    uVar65 = (uVar32 * 0x87 - (ulong)(uint)(iVar46 * 0x1e)) + 0x780;
    bVar67 = true;
    if (local_158 <= uVar65) {
      iVar24 = (uint)bVar33 - (int)uVar32;
      bVar67 = false;
      local_158 = uVar65;
      local_128 = pDVar51;
      local_110 = (DictWord *)uVar32;
    }
  }
LAB_0012042d:
  if (!bVar67) {
    *(long *)(lVar60 + 0x10) = *(long *)(lVar60 + 0x10) + 1;
  }
LAB_00120435:
  uVar59 = uVar59 + 1;
  bVar67 = lVar41 != 0;
  lVar41 = lVar41 + 1;
  if (bVar67) goto LAB_00120014;
  goto LAB_00120316;
code_r0x001200ff:
  uVar59 = uVar59 + 1;
  lVar60 = lVar60 + -8;
  if (uVar57 == uVar59) goto code_r0x00120110;
  goto LAB_001200ed;
code_r0x00120110:
  uVar65 = (ulong)(uVar38 & 7);
  for (uVar59 = -lVar60;
      (uVar65 != 0 && (ringbuffer[uVar59 + (uVar23 & uVar61)] == ringbuffer[uVar59 + uVar28]));
      uVar59 = uVar59 + 1) {
    uVar65 = uVar65 - 1;
  }
LAB_00120145:
  if ((3 < uVar59) && (local_140 < uVar59)) {
    iVar19 = 0x1f;
    if (uVar55 != 0) {
      for (; uVar55 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    uVar65 = (ulong)(iVar19 * -0x1e + 0x780) + uVar59 * 0x87;
    if (local_158 < uVar65) {
      iVar24 = 0;
      local_158 = uVar65;
      local_140 = uVar59;
      local_e8 = (DictWord *)(ulong)uVar55;
    }
  }
LAB_001201b3:
  uVar62 = ~(uint)bVar33 * iVar10 + (uint)bVar6 + uVar62 * iVar46 + 1;
  pDVar48 = (DictWord *)&pDVar48->transform;
  if (puVar27 < pDVar48) goto code_r0x001201d2;
  goto LAB_00120079;
code_r0x001201d2:
  *(uint *)&(params->dictionary).hash_table_lengths = uVar62;
  goto LAB_00120201;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}